

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineTimestampTests.cpp
# Opt level: O1

void __thiscall
vkt::pipeline::anon_unknown_0::TransferTestInstance::configCommandBuffer(TransferTestInstance *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  VkResult VVar6;
  DeviceInterface *pDVar7;
  ulong uVar8;
  pointer pVVar9;
  VkClearColorValue srcClearValue;
  VkImageSubresourceRange subRangeDepth;
  VkImageSubresourceRange subRangeColor;
  VkBufferCopy copyBufRegion;
  VkClearColorValue dstClearValue;
  VkCommandBufferBeginInfo cmdBufferBeginInfo;
  undefined8 *puVar10;
  undefined8 *puVar11;
  undefined8 uVar12;
  undefined4 uVar13;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined4 local_e8;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined4 local_c8;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined4 uStack_a0;
  deInt32 dStack_9c;
  deInt32 dStack_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined8 uStack_8c;
  undefined4 uStack_84;
  undefined8 local_80;
  undefined4 local_78;
  deInt32 local_74;
  deInt32 local_70;
  undefined4 local_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  
  pDVar7 = Context::getDeviceInterface
                     ((this->super_TimestampTestInstance).super_TestInstance.m_context);
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0x2a;
  uStack_54 = 0;
  uStack_50 = 0;
  uStack_4c = 0;
  VVar6 = (*pDVar7->_vptr_DeviceInterface[0x49])
                    (pDVar7,(this->super_TimestampTestInstance).m_cmdBuffer.
                            super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  ::vk::checkResult(VVar6,"vk.beginCommandBuffer(*m_cmdBuffer, &cmdBufferBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineTimestampTests.cpp"
                    ,0x77c);
  (*pDVar7->_vptr_DeviceInterface[0x65])
            (pDVar7,(this->super_TimestampTestInstance).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
             (this->m_dstBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,0,this->m_bufSize,0);
  local_108 = 0x3f8000003f800000;
  uStack_100 = 0x3f8000003f800000;
  local_68 = 0;
  uStack_60 = 0;
  puVar11 = &local_d8;
  local_d8 = 1;
  uStack_d0 = 1;
  local_c8 = 1;
  local_f8 = 2;
  uStack_f0 = 1;
  local_e8 = 1;
  (*(this->super_TimestampTestInstance).super_TestInstance._vptr_TestInstance[5])
            (this,(this->super_TimestampTestInstance).m_cmdBuffer.
                  super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
             (this->m_srcImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
             m_internal,1);
  uVar12 = uStack_d0;
  uVar13 = local_c8;
  (*(this->super_TimestampTestInstance).super_TestInstance._vptr_TestInstance[5])
            (this,(this->super_TimestampTestInstance).m_cmdBuffer.
                  super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
             (this->m_dstImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
             m_internal,1);
  (*pDVar7->_vptr_DeviceInterface[0x66])
            (pDVar7,(this->super_TimestampTestInstance).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
             (this->m_srcImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
             m_internal,1,&local_108,1,puVar11,uVar12,uVar13);
  puVar10 = puVar11;
  (*pDVar7->_vptr_DeviceInterface[0x66])
            (pDVar7,(this->super_TimestampTestInstance).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
             (this->m_dstImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
             m_internal,1,&local_68,1,puVar11);
  uVar13 = (undefined4)((ulong)puVar10 >> 0x20);
  (*pDVar7->_vptr_DeviceInterface[0x70])
            (pDVar7,(this->super_TimestampTestInstance).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
             (this->super_TimestampTestInstance).m_queryPool.
             super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.object.m_internal,0,8);
  if (this->m_method < TRANSFER_METHOD_LAST) {
    uVar5._0_4_ = this->m_imageWidth;
    uVar5._4_4_ = this->m_imageHeight;
    uVar4._0_4_ = this->m_imageWidth;
    uVar4._4_4_ = this->m_imageHeight;
    uVar3._0_4_ = this->m_imageWidth;
    uVar3._4_4_ = this->m_imageHeight;
    uVar2._0_4_ = this->m_imageWidth;
    uVar2._4_4_ = this->m_imageHeight;
    uVar1._0_4_ = this->m_imageWidth;
    uVar1._4_4_ = this->m_imageHeight;
    uVar12._0_4_ = this->m_imageWidth;
    uVar12._4_4_ = this->m_imageHeight;
    switch(this->m_method) {
    case TRANSFER_METHOD_COPY_BUFFER:
      local_b8 = 0;
      uStack_b0 = 0;
      local_a8 = 0x200;
      (*pDVar7->_vptr_DeviceInterface[0x5f])
                (pDVar7,(this->super_TimestampTestInstance).m_cmdBuffer.
                        super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
                 (this->m_srcBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
                 m_internal,
                 (this->m_dstBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
                 m_internal,1);
      break;
    case TRANSFER_METHOD_COPY_IMAGE:
      local_b8 = 1;
      uStack_b0 = 0x100000000;
      uStack_a0 = 0;
      local_a8 = 0;
      dStack_9c = 1;
      dStack_98 = 0;
      uStack_94 = 0;
      uStack_90 = 1;
      uStack_84 = 0;
      uStack_8c = 0;
      local_78 = 1;
      local_80 = uVar5;
      (*pDVar7->_vptr_DeviceInterface[0x60])
                (pDVar7,(this->super_TimestampTestInstance).m_cmdBuffer.
                        super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
                 (this->m_srcImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                 m_internal,1,
                 (this->m_dstImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                 m_internal,1,CONCAT44(uVar13,1),&local_b8);
      break;
    case TRANSFER_METHOD_BLIT_IMAGE:
      local_b8 = 1;
      uStack_b0 = 0x100000000;
      uStack_a0 = 0;
      local_a8 = 0;
      uStack_94 = 1;
      uStack_90 = 1;
      uStack_8c = 0;
      uStack_84 = 1;
      local_78 = 0;
      local_80 = 0;
      local_6c = 1;
      dStack_9c = this->m_imageWidth;
      dStack_98 = this->m_imageHeight;
      local_74 = this->m_imageWidth;
      local_70 = this->m_imageHeight;
      (*pDVar7->_vptr_DeviceInterface[0x61])
                (pDVar7,(this->super_TimestampTestInstance).m_cmdBuffer.
                        super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
                 (this->m_srcImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                 m_internal,1,
                 (this->m_dstImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                 m_internal,1,CONCAT44(uVar13,1),&local_b8,0);
      break;
    case TRANSFER_METHOD_COPY_BUFFER_TO_IMAGE:
      local_b8 = 0;
      local_a8 = 1;
      uStack_a0 = 0;
      dStack_9c = 1;
      dStack_98 = 0;
      uStack_94 = 0;
      uStack_90 = 0;
      uStack_84 = 1;
      uStack_b0 = uVar3;
      uStack_8c = uVar4;
      (*pDVar7->_vptr_DeviceInterface[0x62])
                (pDVar7,(this->super_TimestampTestInstance).m_cmdBuffer.
                        super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
                 (this->m_srcBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
                 m_internal,
                 (this->m_dstImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                 m_internal,1,1,&local_b8);
      break;
    case TRANSFER_METHOD_COPY_IMAGE_TO_BUFFER:
      local_b8 = 0;
      local_a8 = 1;
      uStack_a0 = 0;
      dStack_9c = 1;
      dStack_98 = 0;
      uStack_94 = 0;
      uStack_90 = 0;
      uStack_84 = 1;
      uStack_b0 = uVar12;
      uStack_8c = uVar1;
      (*pDVar7->_vptr_DeviceInterface[99])
                (pDVar7,(this->super_TimestampTestInstance).m_cmdBuffer.
                        super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
                 (this->m_srcImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                 m_internal,1,
                 (this->m_dstBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
                 m_internal,1,&local_b8);
      break;
    case TRANSFER_METHOD_UPDATE_BUFFER:
      local_b8 = 0xabcdef00deadbeef;
      uStack_b0 = CONCAT44(uStack_b0._4_4_,0x12345678);
      (*pDVar7->_vptr_DeviceInterface[100])
                (pDVar7,(this->super_TimestampTestInstance).m_cmdBuffer.
                        super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
                 (this->m_dstBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
                 m_internal,0x10,0xc);
      break;
    case TRANSFER_METHOD_FILL_BUFFER:
      (*pDVar7->_vptr_DeviceInterface[0x65])
                (pDVar7,(this->super_TimestampTestInstance).m_cmdBuffer.
                        super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
                 (this->m_dstBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
                 m_internal,0,this->m_bufSize,0);
      break;
    case TRANSFER_METHOD_CLEAR_COLOR_IMAGE:
      (*pDVar7->_vptr_DeviceInterface[0x66])
                (pDVar7,(this->super_TimestampTestInstance).m_cmdBuffer.
                        super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
                 (this->m_dstImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                 m_internal,1,&local_108,1,puVar11);
      break;
    case TRANSFER_METHOD_CLEAR_DEPTH_STENCIL_IMAGE:
      uVar12 = uStack_f0;
      uVar13 = local_e8;
      (*(this->super_TimestampTestInstance).super_TestInstance._vptr_TestInstance[5])
                (this,(this->super_TimestampTestInstance).m_cmdBuffer.
                      super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
                 (this->m_depthImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                 m_internal,1);
      local_b8 = 0x3f800000;
      (*pDVar7->_vptr_DeviceInterface[0x67])
                (pDVar7,(this->super_TimestampTestInstance).m_cmdBuffer.
                        super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
                 (this->m_depthImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                 m_internal,1,&local_b8,1,&local_f8,uVar12,uVar13);
      break;
    case TRANSFER_METHOD_RESOLVE_IMAGE:
      local_b8 = 1;
      uStack_b0 = 0x100000000;
      uStack_a0 = 0;
      local_a8 = 0;
      dStack_9c = 1;
      dStack_98 = 0;
      uStack_94 = 0;
      uStack_90 = 1;
      uStack_84 = 0;
      uStack_8c = 0;
      local_78 = 1;
      uVar12 = uStack_d0;
      uVar13 = local_c8;
      local_80 = uVar2;
      (*(this->super_TimestampTestInstance).super_TestInstance._vptr_TestInstance[5])
                (this,(this->super_TimestampTestInstance).m_cmdBuffer.
                      super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
                 (this->m_msImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                 m_internal,1);
      (*pDVar7->_vptr_DeviceInterface[0x66])
                (pDVar7,(this->super_TimestampTestInstance).m_cmdBuffer.
                        super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
                 (this->m_msImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                 m_internal,1,&local_108,1,puVar11,uVar12,uVar13);
      (*pDVar7->_vptr_DeviceInterface[0x69])
                (pDVar7,(this->super_TimestampTestInstance).m_cmdBuffer.
                        super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
                 (this->m_msImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                 m_internal,1,
                 (this->m_dstImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                 m_internal,1,CONCAT44((int)((ulong)puVar11 >> 0x20),1),&local_b8);
      break;
    case TRANSFER_METHOD_COPY_QUERY_POOL_RESULTS:
      (*pDVar7->_vptr_DeviceInterface[0x71])
                (pDVar7,(this->super_TimestampTestInstance).m_cmdBuffer.
                        super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,1,
                 (this->super_TimestampTestInstance).m_queryPool.
                 super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.object.m_internal,0);
      (*pDVar7->_vptr_DeviceInterface[0x72])
                (pDVar7,(this->super_TimestampTestInstance).m_cmdBuffer.
                        super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
                 (this->super_TimestampTestInstance).m_queryPool.
                 super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.object.m_internal,0,1,
                 (this->m_dstBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
                 m_internal,0,8,3);
      (*pDVar7->_vptr_DeviceInterface[0x70])
                (pDVar7,(this->super_TimestampTestInstance).m_cmdBuffer.
                        super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
                 (this->super_TimestampTestInstance).m_queryPool.
                 super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.object.m_internal,0,1);
    }
  }
  pVVar9 = (this->super_TimestampTestInstance).m_stages.
           super__Vector_base<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pVVar9 != (this->super_TimestampTestInstance).m_stages.
                super__Vector_base<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    uVar8 = 0;
    do {
      (*pDVar7->_vptr_DeviceInterface[0x71])
                (pDVar7,(this->super_TimestampTestInstance).m_cmdBuffer.
                        super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,(ulong)*pVVar9,
                 (this->super_TimestampTestInstance).m_queryPool.
                 super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.object.m_internal,uVar8);
      pVVar9 = pVVar9 + 1;
      uVar8 = (ulong)((int)uVar8 + 1);
    } while (pVVar9 != (this->super_TimestampTestInstance).m_stages.
                       super__Vector_base<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  VVar6 = (*pDVar7->_vptr_DeviceInterface[0x4a])
                    (pDVar7,(this->super_TimestampTestInstance).m_cmdBuffer.
                            super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  ::vk::checkResult(VVar6,"vk.endCommandBuffer(*m_cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineTimestampTests.cpp"
                    ,0x836);
  return;
}

Assistant:

void TransferTestInstance::configCommandBuffer(void)
{
	const DeviceInterface&      vk                  = m_context.getDeviceInterface();

	const VkCommandBufferBeginInfo cmdBufferBeginInfo =
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,    // VkStructureType                  sType;
		DE_NULL,                                        // const void*                      pNext;
		0u,                                             // VkCmdBufferOptimizeFlags         flags;
		(const VkCommandBufferInheritanceInfo*)DE_NULL,
	};

	VK_CHECK(vk.beginCommandBuffer(*m_cmdBuffer, &cmdBufferBeginInfo));

	// Initialize buffer/image
	vk.cmdFillBuffer(*m_cmdBuffer, *m_dstBuffer, 0u, m_bufSize, 0x0);

	const VkClearColorValue srcClearValue =
	{
		{1.0f, 1.0f, 1.0f, 1.0f}
	};
	const VkClearColorValue dstClearValue =
	{
		{0.0f, 0.0f, 0.0f, 0.0f}
	};
	const struct VkImageSubresourceRange subRangeColor =
	{
		VK_IMAGE_ASPECT_COLOR_BIT,  // VkImageAspectFlags  aspectMask;
		0u,                         // deUint32            baseMipLevel;
		1u,                         // deUint32            mipLevels;
		0u,                         // deUint32            baseArrayLayer;
		1u,                         // deUint32            arraySize;
	};
	const struct VkImageSubresourceRange subRangeDepth =
	{
		VK_IMAGE_ASPECT_DEPTH_BIT,  // VkImageAspectFlags  aspectMask;
		0u,                  // deUint32            baseMipLevel;
		1u,                  // deUint32            mipLevels;
		0u,                  // deUint32            baseArrayLayer;
		1u,                  // deUint32            arraySize;
	};

	initialImageTransition(*m_cmdBuffer, *m_srcImage, subRangeColor, VK_IMAGE_LAYOUT_GENERAL);
	initialImageTransition(*m_cmdBuffer, *m_dstImage, subRangeColor, VK_IMAGE_LAYOUT_GENERAL);

	vk.cmdClearColorImage(*m_cmdBuffer, *m_srcImage, VK_IMAGE_LAYOUT_GENERAL, &srcClearValue, 1u, &subRangeColor);
	vk.cmdClearColorImage(*m_cmdBuffer, *m_dstImage, VK_IMAGE_LAYOUT_GENERAL, &dstClearValue, 1u, &subRangeColor);

	vk.cmdResetQueryPool(*m_cmdBuffer, *m_queryPool, 0u, TimestampTest::ENTRY_COUNT);

	// Copy Operations
	const VkImageSubresourceLayers imgSubResCopy =
	{
		VK_IMAGE_ASPECT_COLOR_BIT,              // VkImageAspectFlags  aspectMask;
		0u,                                     // deUint32            mipLevel;
		0u,                                     // deUint32            baseArrayLayer;
		1u,                                     // deUint32            layerCount;
	};

	const VkOffset3D nullOffset  = {0u, 0u, 0u};
	const VkExtent3D imageExtent = {(deUint32)m_imageWidth, (deUint32)m_imageHeight, 1u};
	const VkOffset3D imageOffset = {(int)m_imageWidth, (int)m_imageHeight, 1};
	switch(m_method)
	{
		case TRANSFER_METHOD_COPY_BUFFER:
			{
				const VkBufferCopy  copyBufRegion =
				{
					0u,      // VkDeviceSize    srcOffset;
					0u,      // VkDeviceSize    destOffset;
					512u,    // VkDeviceSize    copySize;
				};
				vk.cmdCopyBuffer(*m_cmdBuffer, *m_srcBuffer, *m_dstBuffer, 1u, &copyBufRegion);
				break;
			}
		case TRANSFER_METHOD_COPY_IMAGE:
			{
				const VkImageCopy copyImageRegion =
				{
					imgSubResCopy,                          // VkImageSubresourceCopy  srcSubresource;
					nullOffset,                             // VkOffset3D              srcOffset;
					imgSubResCopy,                          // VkImageSubresourceCopy  destSubresource;
					nullOffset,                             // VkOffset3D              destOffset;
					imageExtent,                            // VkExtent3D              extent;

				};
				vk.cmdCopyImage(*m_cmdBuffer, *m_srcImage, VK_IMAGE_LAYOUT_GENERAL, *m_dstImage, VK_IMAGE_LAYOUT_GENERAL, 1u, &copyImageRegion);
				break;
			}
		case TRANSFER_METHOD_COPY_BUFFER_TO_IMAGE:
			{
				const VkBufferImageCopy bufImageCopy =
				{
					0u,                                     // VkDeviceSize            bufferOffset;
					(deUint32)m_imageWidth,                 // deUint32                bufferRowLength;
					(deUint32)m_imageHeight,                // deUint32                bufferImageHeight;
					imgSubResCopy,                          // VkImageSubresourceCopy  imageSubresource;
					nullOffset,                             // VkOffset3D              imageOffset;
					imageExtent,                            // VkExtent3D              imageExtent;
				};
				vk.cmdCopyBufferToImage(*m_cmdBuffer, *m_srcBuffer, *m_dstImage, VK_IMAGE_LAYOUT_GENERAL, 1u, &bufImageCopy);
				break;
			}
		case TRANSFER_METHOD_COPY_IMAGE_TO_BUFFER:
			{
				const VkBufferImageCopy imgBufferCopy =
				{
					0u,                                     // VkDeviceSize            bufferOffset;
					(deUint32)m_imageWidth,                 // deUint32                bufferRowLength;
					(deUint32)m_imageHeight,                // deUint32                bufferImageHeight;
					imgSubResCopy,                          // VkImageSubresourceCopy  imageSubresource;
					nullOffset,                             // VkOffset3D              imageOffset;
					imageExtent,                            // VkExtent3D              imageExtent;
				};
				vk.cmdCopyImageToBuffer(*m_cmdBuffer, *m_srcImage, VK_IMAGE_LAYOUT_GENERAL, *m_dstBuffer, 1u, &imgBufferCopy);
				break;
			}
		case TRANSFER_METHOD_BLIT_IMAGE:
			{
				const VkImageBlit imageBlt =
				{
					imgSubResCopy,                          // VkImageSubresourceCopy  srcSubresource;
					{
						nullOffset,
						imageOffset,
					},
					imgSubResCopy,                          // VkImageSubresourceCopy  destSubresource;
					{
						nullOffset,
						imageOffset,
					}
				};
				vk.cmdBlitImage(*m_cmdBuffer, *m_srcImage, VK_IMAGE_LAYOUT_GENERAL, *m_dstImage, VK_IMAGE_LAYOUT_GENERAL, 1u, &imageBlt, VK_FILTER_NEAREST);
				break;
			}
		case TRANSFER_METHOD_CLEAR_COLOR_IMAGE:
			{
				vk.cmdClearColorImage(*m_cmdBuffer, *m_dstImage, VK_IMAGE_LAYOUT_GENERAL, &srcClearValue, 1u, &subRangeColor);
				break;
			}
		case TRANSFER_METHOD_CLEAR_DEPTH_STENCIL_IMAGE:
			{
				initialImageTransition(*m_cmdBuffer, *m_depthImage, subRangeDepth, VK_IMAGE_LAYOUT_GENERAL);
				const VkClearDepthStencilValue clearDSValue =
				{
					1.0f,                                   // float       depth;
					0u,                                     // deUint32    stencil;
				};
				vk.cmdClearDepthStencilImage(*m_cmdBuffer, *m_depthImage, VK_IMAGE_LAYOUT_GENERAL, &clearDSValue, 1u, &subRangeDepth);
				break;
			}
		case TRANSFER_METHOD_FILL_BUFFER:
			{
				vk.cmdFillBuffer(*m_cmdBuffer, *m_dstBuffer, 0u, m_bufSize, 0x0);
				break;
			}
		case TRANSFER_METHOD_UPDATE_BUFFER:
			{
				const deUint32 data[] =
				{
					0xdeadbeef, 0xabcdef00, 0x12345678
				};
				vk.cmdUpdateBuffer(*m_cmdBuffer, *m_dstBuffer, 0x10, sizeof(data), data);
				break;
			}
		case TRANSFER_METHOD_COPY_QUERY_POOL_RESULTS:
			{
				vk.cmdWriteTimestamp(*m_cmdBuffer, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, *m_queryPool, 0u);
				vk.cmdCopyQueryPoolResults(*m_cmdBuffer, *m_queryPool, 0u, 1u, *m_dstBuffer, 0u, 8u, VK_QUERY_RESULT_64_BIT | VK_QUERY_RESULT_WAIT_BIT);
				vk.cmdResetQueryPool(*m_cmdBuffer, *m_queryPool, 0u, 1u);
				break;
			}
		case TRANSFER_METHOD_RESOLVE_IMAGE:
			{
				const VkImageResolve imageResolve =
				{
					imgSubResCopy,                              // VkImageSubresourceLayers  srcSubresource;
					nullOffset,                                 // VkOffset3D                srcOffset;
					imgSubResCopy,                              // VkImageSubresourceLayers  destSubresource;
					nullOffset,                                 // VkOffset3D                destOffset;
					imageExtent,                                // VkExtent3D                extent;
				};
				initialImageTransition(*m_cmdBuffer, *m_msImage, subRangeColor, VK_IMAGE_LAYOUT_GENERAL);
				vk.cmdClearColorImage(*m_cmdBuffer, *m_msImage, VK_IMAGE_LAYOUT_GENERAL, &srcClearValue, 1u, &subRangeColor);
				vk.cmdResolveImage(*m_cmdBuffer, *m_msImage, VK_IMAGE_LAYOUT_GENERAL, *m_dstImage, VK_IMAGE_LAYOUT_GENERAL, 1u, &imageResolve);
				break;
			}
		default:
			DE_FATAL("Unknown Transfer Method!");
			break;
	};

	deUint32 timestampEntry = 0u;
	for (StageFlagVector::const_iterator it = m_stages.begin(); it != m_stages.end(); it++)
	{
		vk.cmdWriteTimestamp(*m_cmdBuffer, *it, *m_queryPool, timestampEntry++);
	}

	VK_CHECK(vk.endCommandBuffer(*m_cmdBuffer));
}